

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeLinkSensorVariable
          (BerdyHelper *this,BerdySensorTypes sensorType,LinkIndex idx)

{
  IndexRange IVar1;
  long lVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  TraversalIndex trvIdx;
  IndexRange ret;
  undefined8 local_10;
  
  local_10 = iDynTree::IndexRange::InvalidRange();
  if (in_ESI == 0x3ea) {
    if (*(int *)(in_RDI + 0x1b0) == 0) {
      lVar2 = iDynTree::Traversal::getTraversalIndexFromLinkIndex(in_RDI + 0x130);
      if ((*(byte *)(in_RDI + 0x1b8) & 1) == 0) {
        local_10 = *(long *)(in_RDI + 0x2f0) + (lVar2 + -1) * 6;
      }
      else {
        local_10 = *(long *)(in_RDI + 0x2f0) + lVar2 * 6;
      }
    }
    else {
      local_10 = *(long *)(in_RDI + 0x2f0) + in_RDX * 6;
    }
  }
  IVar1.size = 6;
  IVar1.offset = local_10;
  return IVar1;
}

Assistant:

IndexRange BerdyHelper::getRangeLinkSensorVariable(const BerdySensorTypes sensorType, const LinkIndex idx) const
{
    IndexRange ret = IndexRange::InvalidRange();
    ret.size = 6;

    if( sensorType == NET_EXT_WRENCH_SENSOR )
    {
        ret.size = 6;

        if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
        {
            TraversalIndex trvIdx = m_dynamicsTraversal.getTraversalIndexFromLinkIndex(idx);

            if (m_options.includeFixedBaseExternalWrench)
            {
                ret.offset = berdySensorTypeOffsets.netExtWrenchOffset + 6*trvIdx;
            }
            else
            {
                ret.offset = berdySensorTypeOffsets.netExtWrenchOffset + 6*(trvIdx-1);
            }
        }
        else
        {
            ret.offset = berdySensorTypeOffsets.netExtWrenchOffset + 6*idx;
        }
    }

    assert(ret.isValid());
    return ret;
}